

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintFieldName_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,Message *message,
          Reflection *reflection,FieldDescriptor *field)

{
  undefined1 local_58 [8];
  StringBaseTextGenerator generator;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  Message *message_local;
  FieldValuePrinter *this_local;
  
  generator.output_.field_2._8_8_ = field;
  anon_unknown_14::StringBaseTextGenerator::StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_58);
  FastFieldValuePrinter::PrintFieldName
            (&this->delegate_,message,reflection,(FieldDescriptor *)generator.output_.field_2._8_8_,
             (BaseTextGenerator *)local_58);
  protobuf::(anonymous_namespace)::StringBaseTextGenerator::Consume_abi_cxx11_
            (__return_storage_ptr__,local_58);
  anon_unknown_14::StringBaseTextGenerator::~StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintFieldName(
    const Message& message, const Reflection* reflection,
    const FieldDescriptor* field) const {
  FORWARD_IMPL(PrintFieldName, message, reflection, field);
}